

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

size_type __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find_first_of
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> v,size_type pos)

{
  char *pcVar1;
  const_pointer pcVar2;
  char *pcVar3;
  size_type sVar4;
  char *pcVar5;
  char *pcVar6;
  size_type sVar7;
  
  if (this->size_ <= pos) {
    return 0xffffffffffffffff;
  }
  pcVar2 = this->data_;
  pcVar3 = pcVar2 + this->size_;
  for (pcVar5 = pcVar2 + pos; pcVar6 = pcVar3, pcVar5 != pcVar3; pcVar5 = pcVar5 + 1) {
    sVar7 = 0;
    while (v.size_ != sVar7) {
      pcVar1 = v.data_ + sVar7;
      pcVar6 = pcVar5;
      sVar7 = sVar7 + 1;
      if (*pcVar5 == *pcVar1) goto LAB_0019b64d;
    }
  }
LAB_0019b64d:
  sVar4 = 0xffffffffffffffff;
  if (pcVar3 != pcVar6) {
    sVar4 = (long)pcVar6 - (long)pcVar2;
  }
  return sVar4;
}

Assistant:

nssv_constexpr size_type size() const nssv_noexcept { return size_; }